

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O3

void emtdlbl(emtcxdef *ctx,uint *lblp)

{
  if (ctx->emtcxlbl[*lblp].emtllnk == 0xffff) {
    ctx->emtcxlbl[*lblp].emtllnk = ctx->emtcxlfre;
    ctx->emtcxlfre = (ushort)*lblp;
    *lblp = 0xffff;
    return;
  }
  errsigf(ctx->emtcxerr,"TADS",0x192);
}

Assistant:

void emtdlbl(emtcxdef *ctx, noreg uint *lblp)
{
    /* if label has forward references, internal error: label never set */
    if (ctx->emtcxlbl[*lblp].emtllnk != EMTLLNKEND)
        errsig(ctx->emtcxerr, ERR_LBNOSET);
          
    ctx->emtcxlbl[*lblp].emtllnk = ctx->emtcxlfre;
    ctx->emtcxlfre = *lblp;
    *lblp = EMTLLNKEND;
}